

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  cmMessenger *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  bool bVar4;
  bool bVar5;
  string local_260;
  undefined4 local_23c;
  string local_238;
  cmListFileBacktrace local_218;
  undefined1 local_208 [8];
  cmListFileBacktrace lfbt;
  undefined1 local_1e8 [8];
  cmListFileContext lfc;
  ostringstream m;
  Delimiter local_24;
  bool isError;
  cmListFileLexer_Token *pcStack_20;
  Delimiter delim_local;
  cmListFileLexer_Token *token_local;
  cmListFileParser *this_local;
  
  local_24 = delim;
  pcStack_20 = token;
  token_local = (cmListFileLexer_Token *)this;
  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
  emplace_back<char*&,cmListFileArgument::Delimiter&,int&>
            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
             &(this->Function).Arguments,&token->text,&local_24,&token->line);
  if (this->Separation == SeparationOkay) {
    this_local._7_1_ = 1;
  }
  else {
    bVar4 = this->Separation == SeparationError;
    bVar5 = local_24 == Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfc.Line);
    cmListFileContext::cmListFileContext((cmListFileContext *)local_1e8);
    std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),this->FileName);
    lfc.FilePath.field_2._8_8_ = SEXT48(pcStack_20->line);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_208,&this->Backtrace);
    cmListFileBacktrace::Push(&local_218,(cmListFileContext *)local_208);
    cmListFileBacktrace::operator=((cmListFileBacktrace *)local_208,&local_218);
    cmListFileBacktrace::~cmListFileBacktrace(&local_218);
    poVar3 = std::operator<<((ostream *)&lfc.Line,"Syntax ");
    pcVar2 = "CMake Warning";
    if (bVar4 || bVar5) {
      pcVar2 = "CMake Error";
    }
    poVar3 = std::operator<<(poVar3,pcVar2 + 6);
    poVar3 = std::operator<<(poVar3," in cmake code at ");
    poVar3 = std::operator<<(poVar3,"column ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pcStack_20->column);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"Argument not separated from preceding token by whitespace.");
    bVar4 = !bVar4 && !bVar5;
    if (bVar4) {
      pcVar1 = this->Messenger;
      std::__cxx11::ostringstream::str();
      cmMessenger::IssueMessage(pcVar1,AUTHOR_WARNING,&local_260,(cmListFileBacktrace *)local_208);
      std::__cxx11::string::~string((string *)&local_260);
    }
    else {
      pcVar1 = this->Messenger;
      std::__cxx11::ostringstream::str();
      cmMessenger::IssueMessage(pcVar1,FATAL_ERROR,&local_238,(cmListFileBacktrace *)local_208);
      std::__cxx11::string::~string((string *)&local_238);
    }
    local_23c = 1;
    this_local._7_1_ = bVar4;
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_208);
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lfc.Line);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  this->Function.Arguments.emplace_back(token->text, delim, token->line);
  if (this->Separation == SeparationOkay) {
    return true;
  }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = token->line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);

  m << "Syntax " << (isError ? "Error" : "Warning") << " in cmake code at "
    << "column " << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  /* clang-format on */
  if (isError) {
    this->Messenger->IssueMessage(MessageType::FATAL_ERROR, m.str(), lfbt);
    return false;
  }
  this->Messenger->IssueMessage(MessageType::AUTHOR_WARNING, m.str(), lfbt);
  return true;
}